

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall
xray_re::cse_alife_object_physic::state_read
          (cse_alife_object_physic *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  undefined2 uVar2;
  
  uVar1 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_version;
  if (0xd < uVar1) {
    if (uVar1 < 0x10) {
      cse_alife_object::state_read((cse_alife_object *)this,packet,0);
    }
    else {
      cse_alife_dynamic_object_visual::state_read
                (&this->super_cse_alife_dynamic_object_visual,packet,0);
    }
    uVar1 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
            super_cse_alife_object.super_cse_abstract.m_version;
    if (uVar1 < 0x20) {
      cse_visual::visual_read
                (&(this->super_cse_alife_dynamic_object_visual).super_cse_visual,packet,uVar1);
    }
  }
  if (0x3f < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
    cse_ph_skeleton::state_read(&this->super_cse_ph_skeleton,packet,0);
  }
  xr_packet::r_raw(packet,&(this->super_cse_ph_skeleton).field_0x2c,4);
  xr_packet::r_raw(packet,&this->m_mass,4);
  if (9 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_version) {
    xr_packet::r_sz(packet,&this->m_fixed_bones);
  }
  uVar2 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_version;
  if ((ushort)(uVar2 - 0x1d) < 0x24) {
    xr_packet::r_sz(packet,&(this->super_cse_alife_dynamic_object_visual).super_cse_visual.
                            m_startup_animation);
  }
  uVar1 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_version;
  if (uVar1 < 0x40) {
    if (0x27 < uVar1) {
      xr_packet::r_raw(packet,&(this->super_cse_ph_skeleton).m_flags,1);
    }
    if (0x38 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
               super_cse_alife_object.super_cse_abstract.m_version) {
      xr_packet::r_raw(packet,&(this->super_cse_ph_skeleton).m_source_id,2);
    }
    if ((0x3c < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
                super_cse_alife_object.super_cse_abstract.m_version) &&
       (((this->super_cse_ph_skeleton).m_flags & 4) != 0)) {
      (*(this->super_cse_ph_skeleton)._vptr_cse_ph_skeleton[6])(&this->super_cse_ph_skeleton,packet)
      ;
      return;
    }
  }
  return;
}

Assistant:

void cse_alife_object_physic::state_read(xr_packet& packet, uint16_t size)
{
	if (m_version >= CSE_VERSION_0x0e) {
		if (m_version < CSE_VERSION_0x10)
			cse_alife_dynamic_object::state_read(packet, size);
		else
			cse_alife_dynamic_object_visual::state_read(packet, size);
		if (m_version < CSE_VERSION_0x20)
			cse_visual::visual_read(packet, m_version);
	}
	if (m_version >= CSE_VERSION_0x40)
		cse_ph_skeleton::state_read(packet, size);
	packet.r_u32(m_type);
	packet.r_float(m_mass);
	if (m_version > CSE_VERSION_0x09)
		packet.r_sz(m_fixed_bones);
	if (m_version > CSE_VERSION_0x1c && m_version < CSE_VERSION_0x41)
		packet.r_sz(cse_visual::m_startup_animation);
	if (m_version < CSE_VERSION_0x40) {
		if (m_version > CSE_VERSION_0x27)
			packet.r_u8(cse_ph_skeleton::m_flags);
		if (m_version > CSE_VERSION_0x38)
			packet.r_u16(cse_ph_skeleton::m_source_id);
		if ((m_version > CSE_VERSION_0x3c) && (cse_ph_skeleton::m_flags & FL_SAVED_DATA) != 0)
			data_load(packet);
	}
}